

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

void cfl_store_dc_pred(MACROBLOCKD *xd,uint8_t *input,CFL_PRED_TYPE pred_plane,int width)

{
  if ((xd->cur_buf->flags & 8) == 0) {
    memcpy((xd->cfl).dc_pred_cache + pred_plane,input,(long)width);
    return;
  }
  memcpy((xd->cfl).dc_pred_cache + pred_plane,(void *)((long)input * 2),(long)(width * 2));
  return;
}

Assistant:

void cfl_store_dc_pred(MACROBLOCKD *const xd, const uint8_t *input,
                       CFL_PRED_TYPE pred_plane, int width) {
  assert(pred_plane < CFL_PRED_PLANES);
  assert(width <= CFL_BUF_LINE);

  if (is_cur_buf_hbd(xd)) {
    uint16_t *const input_16 = CONVERT_TO_SHORTPTR(input);
    memcpy(xd->cfl.dc_pred_cache[pred_plane], input_16, width << 1);
    return;
  }

  memcpy(xd->cfl.dc_pred_cache[pred_plane], input, width);
}